

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O0

void __thiscall HMISong::SetupForHMP(HMISong *this,int len)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  ulong uVar4;
  TrackInfo *pTVar5;
  int tracklen;
  int start;
  int p;
  int i;
  int track_data;
  int len_local;
  HMISong *this_local;
  
  this->ReadVarLen = ReadVarLenHMP;
  if (this->MusHeader[8] == '\0') {
    p = 0x308;
  }
  else {
    iVar2 = memcmp(this->MusHeader + 8,"013195",7);
    if (iVar2 != 0) {
      return;
    }
    p = 0x388;
  }
  iVar2 = GetInt(this->MusHeader + 0x30);
  this->NumTracks = iVar2;
  if (0 < this->NumTracks) {
    iVar2 = GetInt(this->MusHeader + 0x38);
    (this->super_MIDIStreamer).Division = iVar2;
    (this->super_MIDIStreamer).InitialTempo = 1000000;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(this->NumTracks + 1);
    uVar4 = SUB168(auVar1 * ZEXT816(0x38),0);
    if (SUB168(auVar1 * ZEXT816(0x38),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pTVar5 = (TrackInfo *)operator_new__(uVar4);
    this->Tracks = pTVar5;
    start = 0;
    tracklen = 0;
    while ((start < this->NumTracks && (p <= len + -0xc))) {
      iVar2 = GetInt(this->MusHeader + (long)p + 4);
      iVar3 = MIN<int>(iVar2,len - p);
      if ((0 < iVar3) && (0 < iVar3 + -0xc)) {
        this->Tracks[tracklen].TrackBegin = this->MusHeader + (long)p + 0xc;
        this->Tracks[tracklen].TrackP = 0;
        this->Tracks[tracklen].MaxTrackP = (long)(iVar3 + -0xc);
        this->Tracks[tracklen].Designation[0] = 0xa000;
        this->Tracks[tracklen].Designation[1] = 0xa00a;
        this->Tracks[tracklen].Designation[2] = 0xa002;
        this->Tracks[tracklen].Designation[3] = 0;
        tracklen = tracklen + 1;
      }
      start = start + 1;
      p = iVar2 + p;
    }
    this->NumTracks = tracklen;
  }
  return;
}

Assistant:

void HMISong::SetupForHMP(int len)
{
	int track_data;
	int i, p;

	ReadVarLen = ReadVarLenHMP;
	if (MusHeader[8] == 0)
	{
		track_data = HMP_TRACK_OFFSET_0;
	}
	else if (memcmp(MusHeader + 8, HMP_NEW_DATE, sizeof(HMP_NEW_DATE)) == 0)
	{
		track_data = HMP_TRACK_OFFSET_1;
	}
	else
	{ // unknown HMIMIDIP version
		return;
	}

	NumTracks = GetInt(MusHeader + HMP_TRACK_COUNT_OFFSET);

	if (NumTracks <= 0)
	{
		return;
	}

	// The division is the number of pulses per quarter note (PPQN).
	Division = GetInt(MusHeader + HMP_DIVISION_OFFSET);
	InitialTempo = 1000000;

	Tracks = new TrackInfo[NumTracks + 1];

	// Gather information about each track
	for (i = 0, p = 0; i < NumTracks; ++i)
	{
		int start = track_data;
		int tracklen;

		if (start > len - HMPTRACK_MIDI_DATA_OFFSET)
		{ // Track is incomplete.
			break;
		}

		tracklen = GetInt(MusHeader + start + HMPTRACK_LEN_OFFSET);
		track_data += tracklen;

		// Clamp incomplete tracks to the end of the file.
		tracklen = MIN(tracklen, len - start);
		if (tracklen <= 0)
		{
			continue;
		}

		// Subtract track header size.
		tracklen -= HMPTRACK_MIDI_DATA_OFFSET;
		if (tracklen <= 0)
		{
			continue;
		}

		// Store track information
		Tracks[p].TrackBegin = MusHeader + start + HMPTRACK_MIDI_DATA_OFFSET;
		Tracks[p].TrackP = 0;
		Tracks[p].MaxTrackP = tracklen;

		// Retrieve track designations. We can't check them yet, since we have not yet
		// connected to the MIDI device.
#if 0
		// This is completely a guess based on knowledge of how designations work with
		// HMI files. Some songs contain nothing but zeroes for this data, so I'd rather
		// not go around using it without confirmation.

		Printf("Track %d: %d %08x %d:  \034I", i, GetInt(MusHeader + start),
			GetInt(MusHeader + start + 4), GetInt(MusHeader + start + 8));

		int designations = HMP_DESIGNATIONS_OFFSET +
			GetInt(MusHeader + start + HMPTRACK_DESIGNATION_OFFSET) * 4 * NUM_HMP_DESIGNATIONS;
		for (int ii = 0; ii < NUM_HMP_DESIGNATIONS; ++ii)
		{
			Printf(" %04x", GetInt(MusHeader + designations + ii*4));
		}
		Printf("\n");
#endif
		Tracks[p].Designation[0] = HMI_DEV_GM;
		Tracks[p].Designation[1] = HMI_DEV_GUS;
		Tracks[p].Designation[2] = HMI_DEV_OPL2;
		Tracks[p].Designation[3] = 0;

		p++;
	}

	// In case there were fewer actual chunks in the file than the
	// header specified, update NumTracks with the current value of p.
	NumTracks = p;
}